

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O3

UInt32 Hc4_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit;
  CLzRef CVar1;
  CLzRef CVar2;
  CLzRef CVar3;
  byte *cur;
  CLzRef *pCVar4;
  bool bVar5;
  uint uVar6;
  UInt32 UVar7;
  byte *pbVar8;
  byte *pbVar9;
  UInt32 *pUVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  UInt32 UVar15;
  UInt32 UVar16;
  long lVar17;
  
  lenLimit = p->lenLimit;
  uVar12 = (ulong)lenLimit;
  if (uVar12 < 4) {
    MatchFinder_MovePos(p);
    return 0;
  }
  cur = p->buffer;
  uVar14 = (uint)cur[1] ^ p->crc[*cur];
  uVar6 = (uint)cur[2] << 8 ^ uVar14;
  uVar14 = uVar14 & 0x3ff;
  uVar13 = (ulong)(uVar6 & 0xffff);
  pCVar4 = p->hash;
  CVar1 = p->pos;
  CVar2 = pCVar4[uVar14];
  uVar11 = CVar1 - CVar2;
  CVar3 = pCVar4[uVar13 + 0x400];
  uVar6 = ((p->crc[cur[3]] << 5 ^ uVar6) & p->hashMask) + 0x10400;
  UVar7 = pCVar4[uVar6];
  pCVar4[uVar14] = CVar1;
  pCVar4[uVar13 + 0x400] = CVar1;
  pCVar4[uVar6] = CVar1;
  lVar17 = 0;
  bVar5 = true;
  if ((uVar11 < p->cyclicBufferSize) && (cur[-(ulong)uVar11] == *cur)) {
    *distances = 2;
    distances[1] = uVar11 - 1;
    lVar17 = 2;
    bVar5 = false;
  }
  UVar16 = (UInt32)lVar17;
  if (((CVar3 == CVar2) || (uVar6 = CVar1 - CVar3, p->cyclicBufferSize <= uVar6)) ||
     (uVar13 = (ulong)uVar6, cur[-uVar13] != *cur)) {
    UVar15 = 0;
    uVar6 = 0;
    if (!bVar5) {
      uVar13 = (ulong)uVar11;
      UVar15 = UVar16;
      goto LAB_00114db4;
    }
  }
  else {
    distances[lVar17 + 1] = uVar6 - 1;
    lVar17 = 3;
    UVar15 = UVar16 + 2;
LAB_00114db4:
    pbVar8 = cur + lVar17;
    lVar17 = uVar12 - lVar17;
    do {
      pbVar9 = pbVar8;
      if (pbVar8[-uVar13] != *pbVar8) break;
      pbVar8 = pbVar8 + 1;
      lVar17 = lVar17 + -1;
      pbVar9 = cur + uVar12;
    } while (lVar17 != 0);
    uVar6 = (int)pbVar9 - (int)cur;
    distances[UVar15 - 2] = uVar6;
    if (lenLimit == uVar6) {
      p->son[p->cyclicBufferPos] = UVar7;
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = cur + 1;
      goto LAB_00114e43;
    }
  }
  UVar16 = 3;
  if (3 < uVar6) {
    UVar16 = uVar6;
  }
  pUVar10 = Hc_GetMatchesSpec(lenLimit,UVar7,p->pos,cur,p->son,p->cyclicBufferPos,
                              p->cyclicBufferSize,p->cutValue,distances + UVar15,UVar16);
  UVar15 = (UInt32)((ulong)((long)pUVar10 - (long)distances) >> 2);
  p->cyclicBufferPos = p->cyclicBufferPos + 1;
  p->buffer = p->buffer + 1;
LAB_00114e43:
  UVar7 = p->pos + 1;
  p->pos = UVar7;
  if (UVar7 == p->posLimit) {
    MatchFinder_CheckLimits(p);
  }
  return UVar15;
}

Assistant:

static UInt32 Hc4_MatchFinder_GetMatches(CMatchFinder *p, UInt32 *distances)
{
  UInt32 h2, h3, d2, d3, maxLen, offset, pos;
  UInt32 *hash;
  GET_MATCHES_HEADER(4)

  HASH4_CALC;

  hash = p->hash;
  pos = p->pos;
  
  d2 = pos - hash[                h2];
  d3 = pos - hash[kFix3HashSize + h3];
  
  curMatch = hash[kFix4HashSize + hv];

  hash[                h2] = pos;
  hash[kFix3HashSize + h3] = pos;
  hash[kFix4HashSize + hv] = pos;

  maxLen = 0;
  offset = 0;

  if (d2 < p->cyclicBufferSize && *(cur - d2) == *cur)
  {
    distances[0] = maxLen = 2;
    distances[1] = d2 - 1;
    offset = 2;
  }
  
  if (d2 != d3 && d3 < p->cyclicBufferSize && *(cur - d3) == *cur)
  {
    maxLen = 3;
    distances[offset + 1] = d3 - 1;
    offset += 2;
    d2 = d3;
  }
  
  if (offset != 0)
  {
    UPDATE_maxLen
    distances[offset - 2] = maxLen;
    if (maxLen == lenLimit)
    {
      p->son[p->cyclicBufferPos] = curMatch;
      MOVE_POS_RET;
    }
  }
  
  if (maxLen < 3)
    maxLen = 3;

  offset = (UInt32)(Hc_GetMatchesSpec(lenLimit, curMatch, MF_PARAMS(p),
      distances + offset, maxLen) - (distances));
  MOVE_POS_RET
}